

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void freeIndexInfo(sqlite3 *db,sqlite3_index_info *pIdxInfo)

{
  int local_24;
  int i;
  HiddenIndexInfo *pHidden;
  sqlite3_index_info *pIdxInfo_local;
  sqlite3 *db_local;
  
  for (local_24 = 0; local_24 < pIdxInfo->nConstraint; local_24 = local_24 + 1) {
    sqlite3ValueFree((sqlite3_value *)(&pIdxInfo[1].aConstraintUsage)[local_24]);
    (&pIdxInfo[1].aConstraintUsage)[local_24] = (sqlite3_index_constraint_usage *)0x0;
  }
  sqlite3DbFree(db,pIdxInfo);
  return;
}

Assistant:

static void freeIndexInfo(sqlite3 *db, sqlite3_index_info *pIdxInfo){
  HiddenIndexInfo *pHidden;
  int i;
  assert( pIdxInfo!=0 );
  pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  assert( pHidden->pParse!=0 );
  assert( pHidden->pParse->db==db );
  for(i=0; i<pIdxInfo->nConstraint; i++){
    sqlite3ValueFree(pHidden->aRhs[i]); /* IMP: R-14553-25174 */
    pHidden->aRhs[i] = 0;
  }
  sqlite3DbFree(db, pIdxInfo);
}